

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KinDynComputations.cpp
# Opt level: O0

bool __thiscall
iDynTree::KinDynComputations::setJointPos(KinDynComputations *this,Span<const_double,__1L> s)

{
  Span<const_double,__1L> vec;
  Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *this_00;
  Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *pMVar1;
  pointer in_RDX;
  extent_type<_1L> in_RSI;
  KinDynComputations *in_RDI;
  bool bVar2;
  bool ok;
  VectorDynSize *in_stack_ffffffffffffffa8;
  
  this_00 = (Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *)
            Span<const_double,_-1L>::size((Span<const_double,__1L> *)0x1c97d6);
  pMVar1 = (Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *)
           iDynTree::Model::getNrOfPosCoords();
  bVar2 = this_00 == pMVar1;
  if (bVar2) {
    vec.storage_.data_ = in_RDX;
    vec.storage_.super_extent_type<_1L>.size_ = in_RSI.size_;
    toEigen(vec);
    iDynTree::FreeFloatingPos::jointPos();
    toEigen(in_stack_ffffffffffffffa8);
    Eigen::Map<Eigen::Matrix<double,-1,1,0,-1,1>,0,Eigen::Stride<0,0>>::operator=
              (this_00,(DenseBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
                        *)in_RDI);
    invalidateCache(in_RDI);
  }
  else {
    iDynTree::reportError("KinDynComputations","setJointPos","Wrong size in input joint positions");
  }
  return bVar2;
}

Assistant:

bool KinDynComputations::setJointPos(Span<const double> s)
{
    bool ok = (s.size() == pimpl->m_robot_model.getNrOfPosCoords());
    if( !ok )
    {
        reportError("KinDynComputations","setJointPos","Wrong size in input joint positions");
        return false;
    }

    toEigen(this->pimpl->m_pos.jointPos()) = toEigen(s);

    // Invalidate cache
    this->invalidateCache();

    return true;
}